

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall xLearn::Solver::init_train(Solver *this)

{
  string *score_func;
  string *psVar1;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *pvVar2;
  DMatrix *pDVar3;
  long *plVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  HyperParam *pHVar13;
  Solver *this_00;
  byte bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ThreadPool *this_01;
  ostream *poVar18;
  Reader *pRVar19;
  _func_int **pp_Var20;
  Model *pMVar21;
  Score *pSVar22;
  Loss *this_02;
  Metric *this_03;
  size_t sVar23;
  long lVar24;
  index_t iVar25;
  ulong uVar26;
  char *format;
  ulong uVar27;
  Modifier *this_04;
  ulong uVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  long lVar30;
  index_t *piVar31;
  ushort uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  uint uVar42;
  float fVar43;
  double dVar44;
  Modifier reset_1;
  string filename;
  Modifier green;
  Modifier reset_3;
  Modifier reset;
  Timer timer;
  Modifier local_bc;
  string local_b8;
  string local_98;
  Solver *local_78;
  Modifier local_6c;
  undefined1 local_68 [8];
  iterator iStack_60;
  pointer local_58;
  ulong local_50;
  ulong local_48;
  Timer local_40;
  
  uVar15 = std::thread::hardware_concurrency();
  sVar23 = (size_t)(this->hyper_param_).thread_number;
  uVar28 = (ulong)uVar15;
  if (sVar23 != 0) {
    uVar28 = sVar23;
  }
  this_01 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_01,uVar28);
  this->pool_ = this_01;
  StringPrintf_abi_cxx11_(&local_b8,"xLearn uses %i threads for training task.",uVar28);
  auVar6._12_4_ = 0;
  auVar6._0_12_ = stack0xffffffffffffff9c;
  _local_68 = auVar6 << 0x20;
  local_98._M_dataplus._M_p._0_4_ = 0x20;
  poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[------------] ",0xf);
  poVar18 = Color::operator<<(poVar18,(Modifier *)local_68);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  paVar29 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  Timer::Timer(&local_40);
  Timer::tic(&local_40);
  local_b8._M_dataplus._M_p = (pointer)paVar29;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Read Problem ...","");
  local_68._0_4_ = 1;
  local_bc.code = RESET;
  local_98._M_dataplus._M_p._0_4_ = 0x20;
  poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
  poVar18 = Color::operator<<(poVar18,(Modifier *)local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[ ACTION     ] ",0xf);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  poVar18 = Color::operator<<(poVar18,&local_bc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  auVar7._12_4_ = 0;
  auVar7._0_12_ = stack0xffffffffffffff9c;
  _local_68 = auVar7 << 0x20;
  local_b8._M_dataplus._M_p = (pointer)paVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
  poVar18 = Logger::Start(INFO,&local_b8,0xcf,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Start to init Reader",0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  Logger::~Logger((Logger *)local_68);
  bVar14 = (this->hyper_param_).from_file;
  local_78 = this;
  if (((bool)bVar14 == true) && ((this->hyper_param_).cross_validation == true)) {
    iVar16 = (this->hyper_param_).num_folds;
    if (iVar16 < 1) {
      local_68._0_4_ = 2;
      local_b8._M_dataplus._M_p = (pointer)paVar29;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
                 ,"");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
      poVar18 = Logger::Start(ERR,&local_b8,0xd3,&local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"CHECK_GT failed ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
                 ,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,":",1);
      poVar18 = (ostream *)std::ostream::operator<<((ostream *)poVar18,0xd3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"hyper_param_.num_folds",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18," = ",3);
      poVar18 = (ostream *)
                std::ostream::operator<<((ostream *)poVar18,(local_78->hyper_param_).num_folds);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18," = ",3);
      poVar18 = (ostream *)std::ostream::operator<<((ostream *)poVar18,0);
      std::operator<<(poVar18,"\n");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      this_04 = (Modifier *)local_68;
      goto LAB_00148688;
    }
    FileSpliter::split((FileSpliter *)&this->field_0x268,&(this->hyper_param_).train_set_file,iVar16
                      );
    auVar10._12_4_ = 0;
    auVar10._0_12_ = stack0xffffffffffffff9c;
    _local_68 = auVar10 << 0x20;
    local_b8._M_dataplus._M_p = (pointer)paVar29;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,"");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
    poVar18 = Logger::Start(INFO,&local_b8,0xd6,&local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Split file into ",0x10);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)poVar18,(this->hyper_param_).num_folds)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," parts.",7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar29) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    Logger::~Logger((Logger *)local_68);
    bVar14 = (this->hyper_param_).from_file;
  }
  if ((bVar14 & 1) == 0) {
    _local_68 = (undefined1  [16])0x0;
    local_58 = (pointer)0x0;
    if ((this->hyper_param_).train_dataset == (DMatrix *)0x0) {
      local_bc.code = 2;
      local_b8._M_dataplus._M_p = (pointer)paVar29;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
                 ,"");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
      poVar18 = Logger::Start(ERR,&local_b8,0x109,&local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"CHECK failed ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
                 ,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,":",1);
      poVar18 = (ostream *)std::ostream::operator<<((ostream *)poVar18,0x109);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"hyper_param_.train_dataset",0x1a);
      std::operator<<(poVar18," == NULL \n");
LAB_0014866f:
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      this_04 = &local_bc;
LAB_00148688:
      Logger::~Logger((Logger *)this_04);
      abort();
    }
    std::vector<xLearn::DMatrix*,std::allocator<xLearn::DMatrix*>>::
    _M_realloc_insert<xLearn::DMatrix*const&>
              ((vector<xLearn::DMatrix*,std::allocator<xLearn::DMatrix*>> *)local_68,(iterator)0x0,
               &(this->hyper_param_).train_dataset);
    pDVar3 = (this->hyper_param_).valid_dataset;
    if (pDVar3 == (DMatrix *)0x0) {
      uVar15 = 1;
    }
    else if ((pointer)iStack_60._M_current == local_58) {
      uVar15 = 2;
      std::vector<xLearn::DMatrix*,std::allocator<xLearn::DMatrix*>>::
      _M_realloc_insert<xLearn::DMatrix*const&>
                ((vector<xLearn::DMatrix*,std::allocator<xLearn::DMatrix*>> *)local_68,iStack_60,
                 &(this->hyper_param_).valid_dataset);
    }
    else {
      *iStack_60._M_current = pDVar3;
      iStack_60._M_current = iStack_60._M_current + 1;
      uVar15 = 2;
    }
    local_bc.code = RESET;
    local_b8._M_dataplus._M_p = (pointer)paVar29;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,"");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
    poVar18 = Logger::Start(INFO,&local_b8,0x110,&local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Number of Reader: ",0x12);
    std::ostream::operator<<((ostream *)poVar18,uVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar29) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    Logger::~Logger((Logger *)&local_bc);
    pvVar2 = &this->reader_;
    local_50 = CONCAT44(local_50._4_4_,uVar15);
    local_b8._M_dataplus._M_p = (pointer)0x0;
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
              (pvVar2,(ulong)uVar15,(value_type *)&local_b8);
    uVar26 = 0;
    uVar28 = 0;
    do {
      pRVar19 = create_reader(local_78);
      *(Reader **)
       ((long)(local_78->reader_).
              super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
              super__Vector_impl_data._M_start + uVar28) = pRVar19;
      Reader::SetBlockSize
                (*(Reader **)
                  ((long)(local_78->reader_).
                         super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar28),
                 (long)(local_78->hyper_param_).block_size);
      plVar4 = *(long **)((long)(local_78->reader_).
                                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar28);
      *(int *)(plVar4 + 0x1a) = (local_78->hyper_param_).seed;
      if ((local_78->hyper_param_).bin_out == false) {
        *(undefined1 *)((long)plVar4 + 0x9a) = 0;
      }
      (**(code **)(*plVar4 + 0x18))(plVar4,(long)&((_Alloc_hider *)local_68)->_M_p + uVar28);
      if ((local_78->hyper_param_).on_disk == false) {
        plVar4 = *(long **)((long)(pvVar2->
                                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar28);
        (**(code **)(*plVar4 + 0x40))(plVar4,1);
      }
      if (*(long *)((long)(pvVar2->
                          super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                          _M_impl.super__Vector_impl_data._M_start + uVar28) == 0) {
        StringPrintf_abi_cxx11_(&local_b8,"Cannot open initialze dataset %d",uVar26);
        local_98._M_dataplus._M_p._0_4_ = 0x1f;
        local_bc.code = BOLD;
        local_6c.code = RESET;
        poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
        poVar18 = Color::operator<<(poVar18,&local_bc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[ ERROR      ] ",0xf);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        poVar18 = Color::operator<<(poVar18,&local_6c);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      uVar28 = uVar28 + 8;
      uVar26 = (ulong)((int)uVar26 + 1);
    } while (uVar15 << 3 != uVar28);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68);
    }
  }
  else {
    _local_68 = (undefined1  [16])0x0;
    local_58 = (pointer)0x0;
    if ((this->hyper_param_).cross_validation == true) {
      uVar15 = (this->hyper_param_).num_folds;
      if (0 < (int)uVar15) {
        local_50 = CONCAT44(local_50._4_4_,uVar15);
        uVar15 = 0;
        do {
          StringPrintf_abi_cxx11_
                    (&local_b8,"%s_%d",(this->hyper_param_).train_set_file._M_dataplus._M_p,
                     (ulong)uVar15);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar29) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < (this->hyper_param_).num_folds);
        uVar15 = (uint)local_50;
      }
    }
    else {
      if ((this->hyper_param_).train_set_file._M_string_length == 0) {
        local_bc.code = 2;
        local_b8._M_dataplus._M_p = (pointer)paVar29;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
                   ,"");
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
        poVar18 = Logger::Start(ERR,&local_b8,0xe8,&local_98);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"CHECK_NE failed ",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
                   ,0x5e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,":",1);
        poVar18 = (ostream *)std::ostream::operator<<((ostream *)poVar18,0xe8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"hyper_param_.train_set_file.empty()",0x23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18," = ",3);
        poVar18 = std::ostream::_M_insert<bool>(SUB81(poVar18,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"true",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18," = ",3);
        poVar18 = std::ostream::_M_insert<bool>(SUB81(poVar18,0));
        std::operator<<(poVar18,"\n");
        goto LAB_0014866f;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,&(this->hyper_param_).train_set_file);
      if ((this->hyper_param_).validate_set_file._M_string_length == 0) {
        uVar15 = 1;
      }
      else {
        uVar15 = 2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68,&(this->hyper_param_).validate_set_file);
      }
    }
    local_bc.code = RESET;
    local_b8._M_dataplus._M_p = (pointer)paVar29;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,"");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
    poVar18 = Logger::Start(INFO,&local_b8,0xef,&local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Number of Reader: ",0x12);
    std::ostream::operator<<((ostream *)poVar18,uVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar29) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    Logger::~Logger((Logger *)&local_bc);
    pvVar2 = &this->reader_;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
              (pvVar2,(long)(int)uVar15,(value_type *)&local_b8);
    if ((int)uVar15 < 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68);
      piVar31 = &(this->hyper_param_).num_feature;
      iVar25 = 1;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = iStack_60._M_current;
      _local_68 = auVar11 << 0x40;
      (this->hyper_param_).num_feature = 1;
      goto LAB_00147abc;
    }
    local_50 = CONCAT44(local_50._4_4_,uVar15);
    local_48 = (ulong)uVar15 << 3;
    lVar30 = 0;
    uVar28 = 0;
    do {
      pRVar19 = create_reader(local_78);
      *(Reader **)
       ((long)(local_78->reader_).
              super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
              super__Vector_impl_data._M_start + uVar28) = pRVar19;
      Reader::SetBlockSize
                (*(Reader **)
                  ((long)(local_78->reader_).
                         super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar28),
                 (long)(local_78->hyper_param_).block_size);
      plVar4 = *(long **)((long)(local_78->reader_).
                                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar28);
      *(int *)(plVar4 + 0x1a) = (local_78->hyper_param_).seed;
      if ((local_78->hyper_param_).bin_out == false) {
        *(undefined1 *)((long)plVar4 + 0x9a) = 0;
      }
      (**(code **)(*plVar4 + 0x10))(plVar4,(long)&((_Alloc_hider *)local_68)->_M_p + lVar30);
      if ((local_78->hyper_param_).on_disk == false) {
        plVar4 = *(long **)((long)(pvVar2->
                                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar28);
        (**(code **)(*plVar4 + 0x40))(plVar4,1);
      }
      if (*(long *)((long)(pvVar2->
                          super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                          _M_impl.super__Vector_impl_data._M_start + uVar28) == 0) {
        StringPrintf_abi_cxx11_
                  (&local_b8,"Cannot open the file %s",
                   *(undefined8 *)((long)&((_Alloc_hider *)local_68)->_M_p + uVar28 * 4));
        Color::print_error(&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        exit(0);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_bc.code = RESET;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
                 ,"");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
      poVar18 = Logger::Start(INFO,&local_b8,0x104,&local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Init Reader: ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,*(char **)((long)&((_Alloc_hider *)local_68)->_M_p + uVar28 * 4),
                 *(long *)((long)((long)local_68 + 8) + uVar28 * 4));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      Logger::~Logger((Logger *)&local_bc);
      uVar28 = uVar28 + 8;
      lVar30 = lVar30 + 0x20;
    } while (local_48 != uVar28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
  }
  uVar28 = 0;
  local_48 = local_48 & 0xffffffff00000000;
  uVar15 = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = iStack_60._M_current;
  _local_68 = auVar12 << 0x40;
  local_50 = local_50 & 0xffffffff;
  pHVar13 = &local_78->hyper_param_;
  this = local_78;
  do {
    pp_Var20 = (this->reader_).
               super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar28]->_vptr_Reader;
    while (iVar16 = (*pp_Var20[4])(), this = local_78, iVar16 != 0) {
      if ((ulong)*(uint *)((long)local_68 + 0x10) == 0) {
        uVar42 = 0;
      }
      else {
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        vpmovzxbd_avx512f(_DAT_0018efa8);
        uVar42 = 0;
        uVar26 = 0;
        do {
          plVar4 = *(long **)(*(long *)((long)((long)local_68 + 0x10) + 8) + uVar26 * 8);
          lVar30 = *plVar4;
          lVar24 = plVar4[1];
          if (lVar30 != lVar24) {
            lVar24 = lVar24 - lVar30;
            auVar36 = vpbroadcastd_avx512f();
            uVar27 = 0;
            auVar37 = vpbroadcastq_avx512f();
            auVar37 = vpsrlq_avx512f(auVar37,3);
            do {
              auVar38 = vpbroadcastq_avx512f();
              auVar39 = vmovdqa64_avx512f(auVar36);
              uVar27 = uVar27 + 0x10;
              auVar36 = vporq_avx512f(auVar38,auVar34);
              auVar38 = vporq_avx512f(auVar38,auVar35);
              uVar8 = vpcmpuq_avx512f(auVar38,auVar37,2);
              bVar14 = (byte)uVar8;
              uVar8 = vpcmpuq_avx512f(auVar36,auVar37,2);
              bVar9 = (byte)uVar8;
              uVar32 = CONCAT11(bVar9,bVar14);
              auVar36 = vpgatherdd_avx512f(*(undefined4 *)(lVar30 + 4 + uVar26));
              auVar38._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar36._4_4_;
              auVar38._0_4_ = (uint)(bVar14 & 1) * auVar36._0_4_;
              auVar38._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar36._8_4_;
              auVar38._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar36._12_4_;
              auVar38._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar36._16_4_;
              auVar38._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar36._20_4_;
              auVar38._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar36._24_4_;
              auVar38._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar36._28_4_;
              auVar38._32_4_ = (uint)(bVar9 & 1) * auVar36._32_4_;
              auVar38._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar36._36_4_;
              auVar38._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar36._40_4_;
              auVar38._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar36._44_4_;
              auVar38._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar36._48_4_;
              auVar38._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar36._52_4_;
              auVar38._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar36._56_4_;
              auVar38._60_4_ = (uint)(bVar9 >> 7) * auVar36._60_4_;
              lVar30 = lVar30 + 0xc0;
              auVar36 = vpmaxud_avx512f(auVar38,auVar39);
            } while (((lVar24 - 0xcU) / 0xc + 0x10 & 0x3ffffffffffffff0) != uVar27);
            auVar36 = vmovdqa32_avx512f(auVar36);
            auVar37._0_4_ =
                 (uint)(bVar14 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar39._0_4_;
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar37._4_4_ = (uint)bVar5 * auVar36._4_4_ | (uint)!bVar5 * auVar39._4_4_;
            bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar37._8_4_ = (uint)bVar5 * auVar36._8_4_ | (uint)!bVar5 * auVar39._8_4_;
            bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar37._12_4_ = (uint)bVar5 * auVar36._12_4_ | (uint)!bVar5 * auVar39._12_4_;
            bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar37._16_4_ = (uint)bVar5 * auVar36._16_4_ | (uint)!bVar5 * auVar39._16_4_;
            bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar37._20_4_ = (uint)bVar5 * auVar36._20_4_ | (uint)!bVar5 * auVar39._20_4_;
            bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar37._24_4_ = (uint)bVar5 * auVar36._24_4_ | (uint)!bVar5 * auVar39._24_4_;
            bVar5 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar37._28_4_ = (uint)bVar5 * auVar36._28_4_ | (uint)!bVar5 * auVar39._28_4_;
            auVar37._32_4_ =
                 (uint)(bVar9 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar39._32_4_;
            bVar5 = (bool)(bVar9 >> 1 & 1);
            auVar37._36_4_ = (uint)bVar5 * auVar36._36_4_ | (uint)!bVar5 * auVar39._36_4_;
            bVar5 = (bool)(bVar9 >> 2 & 1);
            auVar37._40_4_ = (uint)bVar5 * auVar36._40_4_ | (uint)!bVar5 * auVar39._40_4_;
            bVar5 = (bool)(bVar9 >> 3 & 1);
            auVar37._44_4_ = (uint)bVar5 * auVar36._44_4_ | (uint)!bVar5 * auVar39._44_4_;
            bVar5 = (bool)(bVar9 >> 4 & 1);
            auVar37._48_4_ = (uint)bVar5 * auVar36._48_4_ | (uint)!bVar5 * auVar39._48_4_;
            bVar5 = (bool)(bVar9 >> 5 & 1);
            auVar37._52_4_ = (uint)bVar5 * auVar36._52_4_ | (uint)!bVar5 * auVar39._52_4_;
            bVar5 = (bool)(bVar9 >> 6 & 1);
            auVar37._56_4_ = (uint)bVar5 * auVar36._56_4_ | (uint)!bVar5 * auVar39._56_4_;
            auVar37._60_4_ =
                 (uint)(bVar9 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar39._60_4_;
            auVar33 = vextracti64x4_avx512f(auVar37,1);
            auVar36 = vpmaxud_avx512f(auVar37,ZEXT3264(auVar33));
            auVar6 = vpmaxud_avx(auVar36._0_16_,auVar36._16_16_);
            auVar7 = vpshufd_avx(auVar6,0xee);
            auVar6 = vpmaxud_avx(auVar6,auVar7);
            auVar7 = vpshufd_avx(auVar6,0x55);
            auVar6 = vpmaxud_avx(auVar6,auVar7);
            uVar42 = auVar6._0_4_;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != *(uint *)((long)local_68 + 0x10));
      }
      if (uVar15 < uVar42) {
        uVar15 = uVar42;
      }
      iVar16 = std::__cxx11::string::compare((char *)&pHVar13->score_func);
      if (iVar16 == 0) {
        if ((ulong)*(uint *)((long)local_68 + 0x10) == 0) {
          uVar42 = 0;
        }
        else {
          auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          vpmovzxbd_avx512f(_DAT_0018efa8);
          uVar42 = 0;
          uVar26 = 0;
          do {
            plVar4 = *(long **)(*(long *)((long)((long)local_68 + 0x10) + 8) + uVar26 * 8);
            lVar30 = *plVar4;
            lVar24 = plVar4[1];
            if (lVar30 != lVar24) {
              lVar24 = lVar24 - lVar30;
              auVar36 = vpbroadcastd_avx512f();
              uVar27 = 0;
              auVar37 = vpbroadcastq_avx512f();
              auVar37 = vpsrlq_avx512f(auVar37,3);
              do {
                auVar38 = vpbroadcastq_avx512f();
                auVar39 = vmovdqa64_avx512f(auVar36);
                uVar27 = uVar27 + 0x10;
                auVar36 = vporq_avx512f(auVar38,auVar34);
                auVar38 = vporq_avx512f(auVar38,auVar35);
                uVar8 = vpcmpuq_avx512f(auVar38,auVar37,2);
                bVar14 = (byte)uVar8;
                uVar8 = vpcmpuq_avx512f(auVar36,auVar37,2);
                bVar9 = (byte)uVar8;
                uVar32 = CONCAT11(bVar9,bVar14);
                auVar36 = vpgatherdd_avx512f(*(undefined4 *)(lVar30 + uVar26));
                auVar40._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar36._4_4_;
                auVar40._0_4_ = (uint)(bVar14 & 1) * auVar36._0_4_;
                auVar40._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar36._8_4_;
                auVar40._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar36._12_4_;
                auVar40._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar36._16_4_;
                auVar40._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar36._20_4_;
                auVar40._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar36._24_4_;
                auVar40._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar36._28_4_;
                auVar40._32_4_ = (uint)(bVar9 & 1) * auVar36._32_4_;
                auVar40._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar36._36_4_;
                auVar40._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar36._40_4_;
                auVar40._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar36._44_4_;
                auVar40._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar36._48_4_;
                auVar40._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar36._52_4_;
                auVar40._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar36._56_4_;
                auVar40._60_4_ = (uint)(bVar9 >> 7) * auVar36._60_4_;
                lVar30 = lVar30 + 0xc0;
                auVar36 = vpmaxud_avx512f(auVar40,auVar39);
              } while (((lVar24 - 0xcU) / 0xc + 0x10 & 0x3ffffffffffffff0) != uVar27);
              auVar36 = vmovdqa32_avx512f(auVar36);
              auVar41._0_4_ =
                   (uint)(bVar14 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar39._0_4_;
              bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar41._4_4_ = (uint)bVar5 * auVar36._4_4_ | (uint)!bVar5 * auVar39._4_4_;
              bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar41._8_4_ = (uint)bVar5 * auVar36._8_4_ | (uint)!bVar5 * auVar39._8_4_;
              bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar41._12_4_ = (uint)bVar5 * auVar36._12_4_ | (uint)!bVar5 * auVar39._12_4_;
              bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
              auVar41._16_4_ = (uint)bVar5 * auVar36._16_4_ | (uint)!bVar5 * auVar39._16_4_;
              bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
              auVar41._20_4_ = (uint)bVar5 * auVar36._20_4_ | (uint)!bVar5 * auVar39._20_4_;
              bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
              auVar41._24_4_ = (uint)bVar5 * auVar36._24_4_ | (uint)!bVar5 * auVar39._24_4_;
              bVar5 = (bool)((byte)(uVar32 >> 7) & 1);
              auVar41._28_4_ = (uint)bVar5 * auVar36._28_4_ | (uint)!bVar5 * auVar39._28_4_;
              auVar41._32_4_ =
                   (uint)(bVar9 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar39._32_4_;
              bVar5 = (bool)(bVar9 >> 1 & 1);
              auVar41._36_4_ = (uint)bVar5 * auVar36._36_4_ | (uint)!bVar5 * auVar39._36_4_;
              bVar5 = (bool)(bVar9 >> 2 & 1);
              auVar41._40_4_ = (uint)bVar5 * auVar36._40_4_ | (uint)!bVar5 * auVar39._40_4_;
              bVar5 = (bool)(bVar9 >> 3 & 1);
              auVar41._44_4_ = (uint)bVar5 * auVar36._44_4_ | (uint)!bVar5 * auVar39._44_4_;
              bVar5 = (bool)(bVar9 >> 4 & 1);
              auVar41._48_4_ = (uint)bVar5 * auVar36._48_4_ | (uint)!bVar5 * auVar39._48_4_;
              bVar5 = (bool)(bVar9 >> 5 & 1);
              auVar41._52_4_ = (uint)bVar5 * auVar36._52_4_ | (uint)!bVar5 * auVar39._52_4_;
              bVar5 = (bool)(bVar9 >> 6 & 1);
              auVar41._56_4_ = (uint)bVar5 * auVar36._56_4_ | (uint)!bVar5 * auVar39._56_4_;
              auVar41._60_4_ =
                   (uint)(bVar9 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar39._60_4_;
              auVar33 = vextracti64x4_avx512f(auVar41,1);
              auVar36 = vpmaxud_avx512f(auVar41,ZEXT3264(auVar33));
              auVar6 = vpmaxud_avx(auVar36._0_16_,auVar36._16_16_);
              auVar7 = vpshufd_avx(auVar6,0xee);
              auVar6 = vpmaxud_avx(auVar6,auVar7);
              auVar7 = vpshufd_avx(auVar6,0x55);
              auVar6 = vpmaxud_avx(auVar6,auVar7);
              uVar42 = auVar6._0_4_;
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != *(uint *)((long)local_68 + 0x10));
        }
        uVar17 = (uint)local_48;
        if ((uint)local_48 < uVar42) {
          uVar17 = uVar42;
        }
        local_48 = CONCAT44(local_48._4_4_,uVar17);
      }
      pp_Var20 = (local_78->reader_).
                 super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar28]->_vptr_Reader;
    }
    (*(local_78->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar28]->_vptr_Reader[5])();
    uVar28 = uVar28 + 1;
  } while (uVar28 != local_50);
  piVar31 = &(this->hyper_param_).num_feature;
  iVar25 = (uint)local_48 + 1;
  (this->hyper_param_).num_feature = uVar15 + 1;
  if (uVar15 + 1 == 0) {
    paVar29 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar29;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Feature index is too large (overflow).","");
    local_bc.code = BOLD;
    local_6c.code = RESET;
    local_98._M_dataplus._M_p._0_4_ = 0x1f;
    poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
    poVar18 = Color::operator<<(poVar18,&local_bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[ ERROR      ] ",0xf);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    poVar18 = Color::operator<<(poVar18,&local_6c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar29) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    local_bc.code = 3;
    local_b8._M_dataplus._M_p = (pointer)paVar29;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,"");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
    poVar18 = Logger::Start(FATAL,&local_b8,0x139,&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"Feature index is too large (overflow).",0x26);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar29) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    Logger::~Logger((Logger *)&local_bc);
  }
LAB_00147abc:
  paVar29 = &local_b8.field_2;
  local_bc.code = RESET;
  local_b8._M_dataplus._M_p = (pointer)paVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
  poVar18 = Logger::Start(INFO,&local_b8,0x13b,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Number of feature: ",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  Logger::~Logger((Logger *)&local_bc);
  StringPrintf_abi_cxx11_(&local_b8,"Number of Feature: %d",(ulong)*piVar31);
  local_bc.code = RESET;
  local_98._M_dataplus._M_p._0_4_ = 0x20;
  poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[------------] ",0xf);
  poVar18 = Color::operator<<(poVar18,&local_bc);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  score_func = &(this->hyper_param_).score_func;
  iVar16 = std::__cxx11::string::compare((char *)score_func);
  if (iVar16 == 0) {
    (this->hyper_param_).num_field = iVar25;
    local_bc.code = RESET;
    local_b8._M_dataplus._M_p = (pointer)paVar29;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,"");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
    poVar18 = Logger::Start(INFO,&local_b8,0x142,&local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Number of field: ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar29) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    Logger::~Logger((Logger *)&local_bc);
    StringPrintf_abi_cxx11_(&local_b8,"Number of Field: %d",(ulong)(this->hyper_param_).num_field);
    local_bc.code = RESET;
    local_98._M_dataplus._M_p._0_4_ = 0x20;
    poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[------------] ",0xf);
    poVar18 = Color::operator<<(poVar18,&local_bc);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar29) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  fVar43 = Timer::toc(&local_40);
  StringPrintf_abi_cxx11_(&local_b8,"Time cost for reading problem: %.2f (sec)",(double)fVar43);
  local_bc.code = RESET;
  local_98._M_dataplus._M_p._0_4_ = 0x20;
  poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[------------] ",0xf);
  poVar18 = Color::operator<<(poVar18,&local_bc);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  Timer::reset(&local_40);
  Timer::tic(&local_40);
  local_b8._M_dataplus._M_p = (pointer)paVar29;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Initialize model ...","");
  local_bc.code = BOLD;
  local_6c.code = RESET;
  local_98._M_dataplus._M_p._0_4_ = 0x20;
  poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
  poVar18 = Color::operator<<(poVar18,&local_bc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[ ACTION     ] ",0xf);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  poVar18 = Color::operator<<(poVar18,&local_6c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((this->hyper_param_).pre_model_file._M_string_length == 0) {
    pMVar21 = (Model *)operator_new(0x90);
    psVar1 = &(this->hyper_param_).opt_type;
    (pMVar21->score_func_)._M_dataplus._M_p = (pointer)&(pMVar21->score_func_).field_2;
    (pMVar21->score_func_)._M_string_length = 0;
    (pMVar21->score_func_).field_2._M_local_buf[0] = '\0';
    (pMVar21->loss_func_)._M_dataplus._M_p = (pointer)&(pMVar21->loss_func_).field_2;
    (pMVar21->loss_func_)._M_string_length = 0;
    (pMVar21->loss_func_).field_2._M_local_buf[0] = '\0';
    pMVar21->param_w_ = (real_t *)0x0;
    pMVar21->param_v_ = (real_t *)0x0;
    pMVar21->param_b_ = (real_t *)0x0;
    pMVar21->param_best_w_ = (real_t *)0x0;
    pMVar21->param_b_ = (real_t *)0x0;
    pMVar21->param_best_w_ = (real_t *)0x0;
    pMVar21->param_best_v_ = (real_t *)0x0;
    pMVar21->param_best_b_ = (real_t *)0x0;
    this->model_ = pMVar21;
    iVar16 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar16 == 0) {
      (this->hyper_param_).auxiliary_size = 1;
      iVar25 = 1;
    }
    else {
      iVar16 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar16 == 0) {
        (this->hyper_param_).auxiliary_size = 2;
        iVar25 = 2;
      }
      else {
        iVar16 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar16 == 0) {
          iVar25 = 3;
          (this->hyper_param_).auxiliary_size = 3;
        }
        else {
          iVar25 = (this->hyper_param_).auxiliary_size;
        }
      }
    }
    Model::Initialize(this->model_,score_func,&(this->hyper_param_).loss_func,
                      (this->hyper_param_).num_feature,(this->hyper_param_).num_field,
                      (this->hyper_param_).num_K,iVar25,(this->hyper_param_).model_scale);
    pMVar21 = this->model_;
  }
  else {
    pMVar21 = (Model *)operator_new(0x90);
    Model::Model(pMVar21,&(this->hyper_param_).pre_model_file);
    this->model_ = pMVar21;
  }
  uVar15 = pMVar21->param_num_w_ + 2 + pMVar21->param_num_v_;
  (this->hyper_param_).num_param = uVar15;
  local_bc.code = RESET;
  local_b8._M_dataplus._M_p = (pointer)paVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
  poVar18 = Logger::Start(INFO,&local_b8,0x168,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Number parameters: ",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  Logger::~Logger((Logger *)&local_bc);
  this_00 = local_78;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  dVar44 = (double)((ulong)uVar15 << 2);
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  if (uVar15 < 0x10000001) {
    if (uVar15 < 0x40001) {
      dVar44 = dVar44 * 0.0009765625;
      format = "%.2f KB";
    }
    else {
      dVar44 = dVar44 * 9.5367431640625e-07;
      format = "%.2f MB";
    }
  }
  else {
    dVar44 = dVar44 * 9.313225746154785e-10;
    format = "%.2f GB";
  }
  SStringPrintf(&local_98,format,dVar44);
  StringPrintf_abi_cxx11_(&local_b8,"Model size: %s",local_98._M_dataplus._M_p);
  local_6c.code = RESET;
  local_bc.code = FG_GREEN;
  poVar18 = Color::operator<<((ostream *)&std::cout,&local_bc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[------------] ",0xf);
  poVar18 = Color::operator<<(poVar18,&local_6c);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  fVar43 = Timer::toc(&local_40);
  StringPrintf_abi_cxx11_(&local_b8,"Time cost for model initial: %.2f (sec)",(double)fVar43);
  local_bc.code = RESET;
  local_98._M_dataplus._M_p._0_4_ = 0x20;
  poVar18 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"[------------] ",0xf);
  poVar18 = Color::operator<<(poVar18,&local_bc);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  pSVar22 = create_score(this_00);
  this_00->score_ = pSVar22;
  (*pSVar22->_vptr_Score[2])
            ((ulong)(uint)(this_00->hyper_param_).learning_rate,
             (ulong)(uint)(this_00->hyper_param_).regu_lambda,
             (ulong)(uint)(this_00->hyper_param_).alpha,(ulong)(uint)(this_00->hyper_param_).beta,
             (ulong)(uint)(this_00->hyper_param_).lambda_1,
             (ulong)(uint)(this_00->hyper_param_).lambda_2,pSVar22,&(this_00->hyper_param_).opt_type
            );
  local_bc.code = RESET;
  local_b8._M_dataplus._M_p = (pointer)paVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
  poVar18 = Logger::Start(INFO,&local_b8,0x17c,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Initialize score function.",0x1a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  Logger::~Logger((Logger *)&local_bc);
  this_02 = create_loss(this_00);
  this_00->loss_ = this_02;
  Loss::Initialize(this_02,this_00->score_,this_00->pool_,(this_00->hyper_param_).norm,
                   (this_00->hyper_param_).lock_free,0);
  local_bc.code = RESET;
  local_b8._M_dataplus._M_p = (pointer)paVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
  poVar18 = Logger::Start(INFO,&local_b8,0x184,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Initialize loss function.",0x19);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  Logger::~Logger((Logger *)&local_bc);
  this_03 = create_metric(this_00);
  this_00->metric_ = this_03;
  if (this_03 != (Metric *)0x0) {
    Metric::Initialize(this_03,this_00->pool_);
  }
  local_bc.code = RESET;
  local_b8._M_dataplus._M_p = (pointer)paVar29;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"init_train","");
  poVar18 = Logger::Start(INFO,&local_b8,0x18c,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Initialize evaluation metric.",0x1d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar29) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  Logger::~Logger((Logger *)&local_bc);
  return;
}

Assistant:

void Solver::init_train() {
  /*********************************************************
   *  Initialize thread pool                               *
   *********************************************************/
  size_t threadNumber = std::thread::hardware_concurrency();
  if (hyper_param_.thread_number != 0) {
    threadNumber = hyper_param_.thread_number;
  }
  pool_ = new ThreadPool(threadNumber);
  Color::print_info(
    StringPrintf("xLearn uses %i threads for training task.",
             threadNumber)
  );
  /*********************************************************
   *  Initialize Reader                                    *
   *********************************************************/
  Timer timer;
  timer.tic();
  Color::print_action("Read Problem ...");
  LOG(INFO) << "Start to init Reader";
  // Split file
  if (hyper_param_.from_file) {
    if (hyper_param_.cross_validation) {
      CHECK_GT(hyper_param_.num_folds, 0);
      splitor_.split(hyper_param_.train_set_file,
                    hyper_param_.num_folds);
      LOG(INFO) << "Split file into "
                << hyper_param_.num_folds
                << " parts.";
    }
  }
  // Get the Reader list
  int num_reader = 0;
  if (hyper_param_.from_file) {
    std::vector<std::string> file_list;
    if (hyper_param_.cross_validation) {
      num_reader += hyper_param_.num_folds;
      for (int i = 0; i < hyper_param_.num_folds; ++i) {
        std::string filename = StringPrintf("%s_%d",
            hyper_param_.train_set_file.c_str(), i);
        file_list.push_back(filename);
      }
    } else {  // do not use cross-validation
      num_reader += 1;  // training file
      CHECK_NE(hyper_param_.train_set_file.empty(), true);
      file_list.push_back(hyper_param_.train_set_file);
      if (!hyper_param_.validate_set_file.empty()) {
        num_reader += 1;  // validation file
        file_list.push_back(hyper_param_.validate_set_file);
      }
    }
    LOG(INFO) << "Number of Reader: " << num_reader;
    reader_.resize(num_reader, nullptr);
    // Create Reader
    for (int i = 0; i < num_reader; ++i) {
      reader_[i] = create_reader();
      reader_[i]->SetBlockSize(hyper_param_.block_size);
      reader_[i]->SetSeed(hyper_param_.seed);
      if (hyper_param_.bin_out == false) {
        reader_[i]->SetNoBin();
      }
      reader_[i]->Initialize(file_list[i]);
      if (!hyper_param_.on_disk) {
        reader_[i]->SetShuffle(true);
      }
      if (reader_[i] == nullptr) {
        Color::print_error(
          StringPrintf("Cannot open the file %s",
              file_list[i].c_str())
        );
        exit(0);
      }
      LOG(INFO) << "Init Reader: " << file_list[i];
    } 
  } else {
    num_reader += 1;  // training dataset
    std::vector<xLearn::DMatrix*> data_list;
    CHECK_NOTNULL(hyper_param_.train_dataset);
    data_list.push_back(hyper_param_.train_dataset);
    if (hyper_param_.valid_dataset != nullptr) {
      num_reader += 1;  // validation dataset
      data_list.push_back(hyper_param_.valid_dataset);
    }
    // Create Reader
    LOG(INFO) << "Number of Reader: " << num_reader;
    reader_.resize(num_reader, nullptr);
    for (int i = 0; i < num_reader; ++i) {
      reader_[i] = create_reader();
      reader_[i]->SetBlockSize(hyper_param_.block_size);
      reader_[i]->SetSeed(hyper_param_.seed);
      if (hyper_param_.bin_out == false) {
        reader_[i]->SetNoBin();
      }
      reader_[i]->Initialize(data_list[i]);
      if (!hyper_param_.on_disk) {
        reader_[i]->SetShuffle(true);
      }
      if (reader_[i] == nullptr) {
        Color::print_error(
          StringPrintf("Cannot open initialze dataset %d", i));
      }
    }
  }
  /*********************************************************
   *  Read problem                                         *
   *********************************************************/
  DMatrix* matrix = nullptr;
  index_t max_feat = 0, max_field = 0;
  for (int i = 0; i < num_reader; ++i) {
    while(reader_[i]->Samples(matrix)) {
      int tmp = matrix->MaxFeat();
      if (tmp > max_feat) { max_feat = tmp; }
      if (hyper_param_.score_func.compare("ffm") == 0) {
        tmp = matrix->MaxField();
        if (tmp > max_field) { max_field = tmp; }
      }
    }
    // Return to the beginning of target file.
    reader_[i]->Reset();
  }
  hyper_param_.num_feature = max_feat + 1;
  // Check overflow:
  // INT_MAX +  = 0
  if (hyper_param_.num_feature == 0) {
    Color::print_error("Feature index is too large (overflow).");
    LOG(FATAL) << "Feature index is too large (overflow).";
  }
  LOG(INFO) << "Number of feature: " << hyper_param_.num_feature;
  Color::print_info(
    StringPrintf("Number of Feature: %d", 
                 hyper_param_.num_feature)
  );
  if (hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_field = max_field + 1;
    LOG(INFO) << "Number of field: " << hyper_param_.num_field;
    Color::print_info(
      StringPrintf("Number of Field: %d", 
        hyper_param_.num_field)
    );
  }
  Color::print_info(
    StringPrintf("Time cost for reading problem: %.2f (sec)",
         timer.toc())
  );
  /*********************************************************
   *  Initialize Model                                     *
   *********************************************************/
  timer.reset();
  timer.tic();
  Color::print_action("Initialize model ...");
  // Initialize parameters from reader
  if (hyper_param_.pre_model_file.empty()) {
    model_ = new Model();
    if (hyper_param_.opt_type.compare("sgd") == 0) {
      hyper_param_.auxiliary_size = 1;
    } else if (hyper_param_.opt_type.compare("adagrad") == 0) {
      hyper_param_.auxiliary_size = 2;
    } else if (hyper_param_.opt_type.compare("ftrl") == 0) {
      hyper_param_.auxiliary_size = 3;
    }
    model_->Initialize(hyper_param_.score_func,
                     hyper_param_.loss_func,
                     hyper_param_.num_feature,
                     hyper_param_.num_field,
                     hyper_param_.num_K,
                     hyper_param_.auxiliary_size,
                     hyper_param_.model_scale);
  } else { // Initialize parameter from pre-trained model
    model_ = new Model(hyper_param_.pre_model_file);
  }
  index_t num_param = model_->GetNumParameter();
  hyper_param_.num_param = num_param;
  LOG(INFO) << "Number parameters: " << num_param;
  Color::print_info(
    StringPrintf("Model size: %s", 
         PrintSize(num_param*sizeof(real_t)).c_str())
  );
  Color::print_info(
    StringPrintf("Time cost for model initial: %.2f (sec)",
         timer.toc())
  );
  /*********************************************************
   *  Initialize score function                            *
   *********************************************************/
  score_ = create_score();
  score_->Initialize(hyper_param_.learning_rate,
                     hyper_param_.regu_lambda,
                     hyper_param_.alpha,
                     hyper_param_.beta,
                     hyper_param_.lambda_1,
                     hyper_param_.lambda_2,
                     hyper_param_.opt_type);
  LOG(INFO) << "Initialize score function.";
  /*********************************************************
   *  Initialize loss function                             *
   *********************************************************/
  loss_ = create_loss();
  loss_->Initialize(score_, pool_, 
         hyper_param_.norm, 
         hyper_param_.lock_free);
  LOG(INFO) << "Initialize loss function.";
  /*********************************************************
   *  Init metric                                          *
   *********************************************************/
  metric_ = create_metric();
  if (metric_ != nullptr) {
    metric_->Initialize(pool_);
  }
  LOG(INFO) << "Initialize evaluation metric.";
}